

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O2

time_t ngx_next_time(time_t when)

{
  time_t s;
  short sVar1;
  time_t tVar2;
  undefined1 local_58 [8];
  tm tm;
  
  s = ngx_cached_time->sec;
  ngx_libc_localtime(s,(tm *)local_58);
  tm.tm_sec = (int)(when / 0xe10);
  sVar1 = (short)(when % 0xe10);
  local_58._4_4_ = SEXT24(sVar1 / 0x3c);
  local_58._0_4_ = SEXT24(sVar1 % 0x3c);
  tVar2 = mktime((tm *)local_58);
  if (tVar2 == -1) {
    tVar2 = -1;
  }
  else if (tVar2 <= s) {
    tm.tm_min = tm.tm_min + 1;
    tVar2 = mktime((tm *)local_58);
  }
  return tVar2;
}

Assistant:

time_t
ngx_next_time(time_t when)
{
    time_t     now, next;
    struct tm  tm;

    now = ngx_time();

    ngx_libc_localtime(now, &tm);

    tm.tm_hour = (int) (when / 3600);
    when %= 3600;
    tm.tm_min = (int) (when / 60);
    tm.tm_sec = (int) (when % 60);

    next = mktime(&tm);

    if (next == -1) {
        return -1;
    }

    if (next - now > 0) {
        return next;
    }

    tm.tm_mday++;

    /* mktime() should normalize a date (Jan 32, etc) */

    next = mktime(&tm);

    if (next != -1) {
        return next;
    }

    return -1;
}